

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d4c.cc
# Opt level: O0

void sptk::world::anon_unknown_1::GetCoarseAperiodicity
               (double *static_group_delay,int fs,int fft_size,int number_of_aperiodicities,
               double *window,int window_length,ForwardRealFFT *forward_real_fft,
               double *coarse_aperiodicity)

{
  undefined1 auVar1 [16];
  double dVar2;
  fft_plan p;
  ulong uVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  undefined8 unaff_retaddr;
  long in_stack_00000008;
  long in_stack_00000010;
  undefined8 uStack0000000000000018;
  undefined8 uStack0000000000000020;
  int j_2;
  int j_1;
  int j;
  int i_1;
  int center;
  double *power_spectrum;
  int i;
  int half_window_length;
  int boundary;
  double *__last;
  double *__first;
  int local_98;
  int local_94;
  undefined1 local_90 [16];
  double *local_80;
  double *pdStack_78;
  int local_44;
  int local_40;
  int local_3c;
  void *local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  undefined4 in_stack_ffffffffffffffe8;
  
  local_24 = in_R9D;
  local_28 = matlab_round(((double)in_EDX * 8.0) / (double)in_R9D);
  local_2c = local_24 / 2;
  for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
    *(undefined8 *)(*(long *)(in_stack_00000008 + 8) + (long)local_30 * 8) = 0;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(in_EDX / 2 + 1);
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  local_38 = operator_new__(uVar3);
  for (local_40 = 0; local_40 < in_ECX; local_40 = local_40 + 1) {
    local_3c = (int)(((double)(local_40 + 1) * 3000.0 * (double)in_EDX) / (double)in_ESI);
    for (local_44 = 0;
        local_44 == local_2c * 2 || SBORROW4(local_44,local_2c * 2) != local_44 + local_2c * -2 < 0;
        local_44 = local_44 + 1) {
      *(double *)(*(long *)(in_stack_00000008 + 8) + (long)local_44 * 8) =
           *(double *)(in_RDI + (long)((local_3c - local_2c) + local_44) * 8) *
           *(double *)(in_R8 + (long)local_44 * 8);
    }
    memcpy(local_90,(void *)(in_stack_00000008 + 0x18),0x48);
    p.flags = in_stack_ffffffffffffffe8;
    p.n = (int)in_R8;
    p.sign = (int)((ulong)in_R8 >> 0x20);
    p._12_4_ = in_ECX;
    p.c_in._0_4_ = in_EDX;
    p.c_in._4_4_ = in_ESI;
    p.in = (double *)in_RDI;
    p.out = (double *)in_stack_00000008;
    p.c_out = (fft_complex *)unaff_retaddr;
    p.input = (double *)in_stack_00000010;
    p.ip = (int *)uStack0000000000000018;
    p.w = (double *)uStack0000000000000020;
    __last = local_80;
    __first = pdStack_78;
    fft_execute(p);
    for (local_94 = 0; local_94 <= in_EDX / 2; local_94 = local_94 + 1) {
      *(double *)((long)local_38 + (long)local_94 * 8) =
           *(double *)(*(long *)(in_stack_00000008 + 0x10) + (long)local_94 * 0x10) *
           *(double *)(*(long *)(in_stack_00000008 + 0x10) + (long)local_94 * 0x10) +
           *(double *)(*(long *)(in_stack_00000008 + 0x10) + (long)local_94 * 0x10 + 8) *
           *(double *)(*(long *)(in_stack_00000008 + 0x10) + (long)local_94 * 0x10 + 8);
    }
    std::sort<double*>(__first,__last);
    for (local_98 = 1; local_98 <= in_EDX / 2; local_98 = local_98 + 1) {
      *(double *)((long)local_38 + (long)local_98 * 8) =
           *(double *)((long)local_38 + (long)(local_98 + -1) * 8) +
           *(double *)((long)local_38 + (long)local_98 * 8);
    }
    dVar2 = log10(*(double *)((long)local_38 + (long)((in_EDX / 2 - local_28) + -1) * 8) /
                  *(double *)((long)local_38 + (long)(in_EDX / 2) * 8));
    *(double *)(in_stack_00000010 + (long)local_40 * 8) = dVar2 * 10.0;
  }
  if (local_38 != (void *)0x0) {
    operator_delete__(local_38);
  }
  return;
}

Assistant:

static void GetCoarseAperiodicity(const double *static_group_delay, int fs,
    int fft_size, int number_of_aperiodicities, const double *window,
    int window_length, const ForwardRealFFT *forward_real_fft,
    double *coarse_aperiodicity) {
  int boundary =
    matlab_round(fft_size * 8.0 / window_length);
  int half_window_length = window_length / 2;

  for (int i = 0; i < fft_size; ++i) forward_real_fft->waveform[i] = 0.0;

  double *power_spectrum = new double[fft_size / 2 + 1];
  int center;
  for (int i = 0; i < number_of_aperiodicities; ++i) {
    center =
      static_cast<int>(world::kFrequencyInterval * (i + 1) * fft_size / fs);
    for (int j = 0; j <= half_window_length * 2; ++j)
      forward_real_fft->waveform[j] =
        static_group_delay[center - half_window_length + j] * window[j];
    fft_execute(forward_real_fft->forward_fft);
    for (int j = 0 ; j <= fft_size / 2; ++j)
      power_spectrum[j] =
        forward_real_fft->spectrum[j][0] * forward_real_fft->spectrum[j][0] +
        forward_real_fft->spectrum[j][1] * forward_real_fft->spectrum[j][1];
    std::sort(power_spectrum, power_spectrum + fft_size / 2 + 1);
    for (int j = 1 ; j <= fft_size / 2; ++j)
      power_spectrum[j] += power_spectrum[j - 1];
    coarse_aperiodicity[i] =
      10 * log10(power_spectrum[fft_size / 2 - boundary - 1] /
                 power_spectrum[fft_size / 2]);
  }
  delete[] power_spectrum;
}